

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

Float pbrt::HairBxDF::Mp(Float cosTheta_i,Float cosTheta_o,Float sinTheta_i,Float sinTheta_o,Float v
                        )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int64_t ifact;
  long lVar3;
  int i4;
  float fVar4;
  uint uVar5;
  int i;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar9 = (cosTheta_i * cosTheta_o) / v;
  fVar7 = (sinTheta_i * sinTheta_o) / v;
  if (v <= 0.1) {
    if (fVar9 <= 12.0) {
      fVar4 = 0.0;
      fVar8 = 1.0;
      lVar3 = 1;
      uVar5 = 1;
      iVar6 = 0;
      do {
        lVar3 = lVar3 * (ulong)(iVar6 + (uint)(iVar6 == 0));
        fVar4 = fVar4 + fVar8 / (float)(long)((ulong)uVar5 * lVar3 * lVar3);
        fVar8 = fVar9 * fVar9 * fVar8;
        uVar5 = uVar5 << 2;
        iVar6 = iVar6 + 1;
      } while (iVar6 != 10);
      fVar9 = logf(fVar4);
    }
    else {
      fVar4 = logf(1.0 / fVar9);
      auVar1 = vfmadd132ss_fma(ZEXT416((uint)(1.0 / (fVar9 * 8.0) + fVar4 + -1.837877)),
                               ZEXT416((uint)fVar9),ZEXT416(0x3f000000));
      fVar9 = auVar1._0_4_;
    }
    fVar4 = logf(1.0 / (v + v));
    fVar7 = (fVar4 + ((fVar9 - fVar7) - 1.0 / v) + 0.6931) * 1.442695;
    auVar1 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
    fVar7 = fVar7 - auVar1._0_4_;
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar7),ZEXT416(0x3e679a0b)
                            );
    auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)fVar7),ZEXT416(0x3f321004));
    auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)fVar7),ZEXT416(0x3f800000));
    iVar6 = (int)auVar1._0_4_ + -0x7f + (auVar2._0_4_ >> 0x17);
    fVar7 = 0.0;
    if (-0x7f < iVar6) {
      if (iVar6 < 0x80) {
        fVar7 = (float)(iVar6 * 0x800000 + 0x3f800000U | auVar2._0_4_ & 0x807fffff);
      }
      else {
        fVar7 = INFINITY;
      }
    }
  }
  else {
    fVar7 = fVar7 * -1.442695;
    auVar1 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
    fVar7 = fVar7 - auVar1._0_4_;
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar7),ZEXT416(0x3e679a0b)
                            );
    auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)fVar7),ZEXT416(0x3f321004));
    auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)fVar7),ZEXT416(0x3f800000));
    iVar6 = (int)auVar1._0_4_ + -0x7f + (auVar2._0_4_ >> 0x17);
    fVar7 = 0.0;
    fVar4 = 0.0;
    if (-0x7f < iVar6) {
      if (iVar6 < 0x80) {
        fVar4 = (float)(iVar6 * 0x800000 + 0x3f800000U | auVar2._0_4_ & 0x807fffff);
      }
      else {
        fVar4 = INFINITY;
      }
    }
    fVar8 = 1.0;
    lVar3 = 1;
    uVar5 = 1;
    iVar6 = 0;
    do {
      lVar3 = lVar3 * (ulong)(iVar6 + (uint)(iVar6 == 0));
      fVar7 = fVar7 + fVar8 / (float)(long)((ulong)uVar5 * lVar3 * lVar3);
      fVar8 = fVar9 * fVar9 * fVar8;
      uVar5 = uVar5 << 2;
      iVar6 = iVar6 + 1;
    } while (iVar6 != 10);
    fVar9 = sinhf(1.0 / v);
    fVar7 = (fVar4 * fVar7) / ((fVar9 + fVar9) * v);
  }
  if ((uint)ABS(fVar7) < 0x7f800000) {
    return fVar7;
  }
  LogFatal<char_const(&)[25]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.h"
             ,0x3ec,"Check failed: %s",(char (*) [25])"!IsInf(mp) && !IsNaN(mp)");
}

Assistant:

PBRT_CPU_GPU
    static Float Mp(Float cosTheta_i, Float cosTheta_o, Float sinTheta_i,
                    Float sinTheta_o, Float v) {
        Float a = cosTheta_i * cosTheta_o / v;
        Float b = sinTheta_i * sinTheta_o / v;
        Float mp = (v <= .1)
                       ? (FastExp(LogI0(a) - b - 1 / v + 0.6931f + std::log(1 / (2 * v))))
                       : (FastExp(-b) * I0(a)) / (std::sinh(1 / v) * 2 * v);
        CHECK(!IsInf(mp) && !IsNaN(mp));
        return mp;
    }